

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

void __thiscall
QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(QAbstractScrollAreaPrivate *this)

{
  QFramePrivate::QFramePrivate(&this->super_QFramePrivate);
  *(undefined ***)&(this->super_QFramePrivate).super_QWidgetPrivate =
       &PTR__QAbstractScrollAreaPrivate_007c4620;
  this->hbar = (QScrollBar *)0x0;
  this->vbar = (QScrollBar *)0x0;
  *(undefined8 *)((long)&this->vbar + 2) = 0;
  *(undefined8 *)((long)&this->vbarpolicy + 2) = 0;
  (this->sizeHint).wd = -1;
  (this->sizeHint).ht = -1;
  *(undefined8 *)&this->sizeAdjustPolicy = 0;
  *(undefined8 *)((long)&this->viewport + 4) = 0;
  this->cornerWidget = (QWidget *)0x0;
  (this->cornerPaintingRect).x1 = 0;
  (this->cornerPaintingRect).y1 = 0;
  (this->cornerPaintingRect).x2 = -1;
  (this->cornerPaintingRect).y2 = -1;
  this->left = 0;
  this->top = 0;
  this->right = 0;
  this->bottom = 0;
  this->xoffset = 0;
  this->yoffset = 0;
  (this->overshoot).xp = 0;
  (this->overshoot).yp = 0;
  (this->viewportFilter).d = (QObject *)0x0;
  return;
}

Assistant:

QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate()
    :hbar(nullptr), vbar(nullptr), vbarpolicy(Qt::ScrollBarAsNeeded), hbarpolicy(Qt::ScrollBarAsNeeded),
     shownOnce(false), inResize(false), sizeAdjustPolicy(QAbstractScrollArea::AdjustIgnored),
     viewport(nullptr), cornerWidget(nullptr), left(0), top(0), right(0), bottom(0),
     xoffset(0), yoffset(0), viewportFilter(nullptr)
{
}